

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O0

Aig_Obj_t *
Kit_TruthToAig(Aig_Man_t *pMan,Aig_Obj_t **pFanins,uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  Vec_Int_t *vMemory_00;
  Aig_Obj_t *pAVar1;
  undefined8 local_40;
  Kit_Graph_t *pGraph;
  Aig_Obj_t *pObj;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *pTruth_local;
  Aig_Obj_t **pFanins_local;
  Aig_Man_t *pMan_local;
  
  if (vMemory == (Vec_Int_t *)0x0) {
    vMemory_00 = Vec_IntAlloc(0);
    local_40 = Kit_TruthToGraph(pTruth,nVars,vMemory_00);
    Vec_IntFree(vMemory_00);
  }
  else {
    local_40 = Kit_TruthToGraph(pTruth,nVars,vMemory);
  }
  pAVar1 = Kit_GraphToAig(pMan,pFanins,local_40);
  Kit_GraphFree(local_40);
  return pAVar1;
}

Assistant:

Aig_Obj_t * Kit_TruthToAig( Aig_Man_t * pMan, Aig_Obj_t ** pFanins, unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Aig_Obj_t * pObj;
    Kit_Graph_t * pGraph;
    // transform truth table into the decomposition tree
    if ( vMemory == NULL )
    {
        vMemory = Vec_IntAlloc( 0 );
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
        Vec_IntFree( vMemory );
    }
    else
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
    // derive the AIG for the decomposition tree
    pObj = Kit_GraphToAig( pMan, pFanins, pGraph );
    Kit_GraphFree( pGraph );
    return pObj;
}